

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseConst(WastParser *this,Const *const_,ConstType const_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Enum EVar2;
  TokenType TVar3;
  Literal *pLVar4;
  const_iterator pcVar5;
  const_iterator pcVar6;
  char *format;
  string *local_240;
  string local_228;
  char *local_208;
  size_type local_200;
  size_t local_1f8;
  undefined8 local_1f0;
  Enum local_1e8;
  Enum local_1e4;
  Enum local_1e0;
  Enum local_1dc;
  Enum local_1d8;
  Enum local_1d4;
  uint64_t local_1d0;
  uint64_t u64;
  undefined1 local_188 [8];
  string_view sv_1;
  undefined1 local_170 [4];
  uint32_t u32;
  undefined1 local_130 [8];
  string_view sv;
  Result result;
  iterator local_f8;
  size_type local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 local_d0 [8];
  Token token;
  size_type local_88;
  size_t local_80;
  undefined8 local_78;
  Opcode local_6c;
  undefined1 local_68 [4];
  Opcode opcode;
  Token opcode_token;
  ConstType const_type_local;
  Const *const__local;
  WastParser *this_local;
  
  Consume((Token *)local_68,this);
  local_6c = Token::opcode((Token *)local_68);
  GetLocation((Location *)&token.field_2.literal_.text.size_,this);
  (const_->loc).filename.data_ = (char *)token.field_2.literal_.text.size_;
  (const_->loc).filename.size_ = local_88;
  (const_->loc).field_1.field_1.offset = local_80;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_78;
  GetToken((Token *)local_d0,this);
  EVar2 = Opcode::operator_cast_to_Enum(&local_6c);
  if (((EVar2 == V128Const) ||
      (TVar3 = Token::token_type((Token *)local_d0), TVar3 - NanArithmetic < 2)) ||
     (TVar3 - First_Literal < 3)) {
    Result::Result((Result *)&sv.size_);
    EVar2 = Opcode::operator_cast_to_Enum(&local_6c);
    if (EVar2 == I32Const) {
      Consume((Token *)local_170,this);
      pLVar4 = Token::literal((Token *)local_170);
      local_130 = (undefined1  [8])(pLVar4->text).data_;
      sv.data_ = (char *)(pLVar4->text).size_;
      pcVar5 = string_view::begin((string_view *)local_130);
      pcVar6 = string_view::end((string_view *)local_130);
      sv_1.size_._0_4_ =
           ParseInt32(pcVar5,pcVar6,(uint32_t *)((long)&sv_1.size_ + 4),SignedAndUnsigned);
      sv.size_._0_4_ = sv_1.size_._0_4_;
      Const::set_u32(const_,sv_1.size_._4_4_);
    }
    else if (EVar2 == I64Const) {
      Consume((Token *)&u64,this);
      pLVar4 = Token::literal((Token *)&u64);
      local_188 = (undefined1  [8])(pLVar4->text).data_;
      sv_1.data_ = (char *)(pLVar4->text).size_;
      pcVar5 = string_view::begin((string_view *)local_188);
      pcVar6 = string_view::end((string_view *)local_188);
      local_1d4 = (Enum)ParseInt64(pcVar5,pcVar6,&local_1d0,SignedAndUnsigned);
      sv.size_._0_4_ = (Result)local_1d4;
      Const::set_u64(const_,local_1d0);
    }
    else if (EVar2 == F32Const) {
      local_1d8 = (Enum)ParseF32(this,const_,const_type);
      sv.size_._0_4_ = (Result)local_1d8;
    }
    else if (EVar2 == F64Const) {
      local_1dc = (Enum)ParseF64(this,const_,const_type);
      sv.size_._0_4_ = (Result)local_1dc;
    }
    else {
      if (EVar2 != V128Const) {
        __assert_fail("!\"ParseConst called with invalid opcode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                      ,0x922,"Result wabt::WastParser::ParseConst(Const *, ConstType)");
      }
      ErrorUnlessOpcodeEnabled(this,(Token *)local_68);
      TVar3 = Token::token_type((Token *)local_d0);
      local_1e4 = (Enum)ParseSimdV128Const(this,const_,TVar3,const_type);
      local_1e0 = local_1e4;
      sv.size_._0_4_ = (Result)local_1e4;
      bVar1 = Failed((Result)local_1e4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    local_1e8 = sv.size_._0_4_;
    bVar1 = Failed(sv.size_._0_4_);
    if (bVar1) {
      local_208 = (const_->loc).filename.data_;
      local_200 = (const_->loc).filename.size_;
      local_1f8 = (const_->loc).field_1.field_1.offset;
      local_1f0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
      Token::to_string_abi_cxx11_(&local_228,(Token *)local_d0);
      format = (char *)std::__cxx11::string::c_str();
      Error(this,0x2ddc16,format);
      std::__cxx11::string::~string((string *)&local_228);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&result,"a numeric literal",(allocator *)((long)&sv.size_ + 7));
    local_f8 = (iterator)&result;
    local_f0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&sv.size_ + 6));
    __l._M_len = local_f0;
    __l._M_array = local_f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,__l,(allocator_type *)((long)&sv.size_ + 6));
    this_local._4_4_ = ErrorExpected(this,&local_e8,"123, -45, 6.7e8");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&sv.size_ + 6));
    local_240 = (string *)&local_f8;
    do {
      local_240 = local_240 + -0x20;
      std::__cxx11::string::~string(local_240);
    } while (local_240 != (string *)&result);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sv.size_ + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseConst(Const* const_, ConstType const_type) {
  WABT_TRACE(ParseConst);
  Token opcode_token = Consume();
  Opcode opcode = opcode_token.opcode();
  const_->loc = GetLocation();
  Token token = GetToken();

  // V128 is fully handled by ParseSimdV128Const:
  if (opcode != Opcode::V128Const) {
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
      case TokenType::Float:
        // OK.
        break;
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        break;
      default:
        return ErrorExpected({"a numeric literal"}, "123, -45, 6.7e8");
    }
  }

  Result result;
  switch (opcode) {
    case Opcode::I32Const: {
      auto sv = Consume().literal().text;
      uint32_t u32;
      result = ParseInt32(sv.begin(), sv.end(), &u32,
                          ParseIntType::SignedAndUnsigned);
      const_->set_u32(u32);
      break;
    }

    case Opcode::I64Const: {
      auto sv = Consume().literal().text;
      uint64_t u64;
      result = ParseInt64(sv.begin(), sv.end(), &u64,
                          ParseIntType::SignedAndUnsigned);
      const_->set_u64(u64);
      break;
    }

    case Opcode::F32Const:
      result = ParseF32(const_, const_type);
      break;

    case Opcode::F64Const:
      result = ParseF64(const_, const_type);
      break;

    case Opcode::V128Const:
      ErrorUnlessOpcodeEnabled(opcode_token);
      // Parse V128 Simd Const (16 bytes).
      result = ParseSimdV128Const(const_, token.token_type(), const_type);
      // ParseSimdV128Const report error already, just return here if parser get
      // errors.
      if (Failed(result)) {
        return Result::Error;
      }
      break;

    default:
      assert(!"ParseConst called with invalid opcode");
      return Result::Error;
  }

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"%s\"", token.to_string().c_str());
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}